

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_error.hpp
# Opt level: O0

void __thiscall boost::system::system_error::~system_error(system_error *this)

{
  system_error *in_RDI;
  
  ~system_error(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

virtual ~system_error() BOOST_NOEXCEPT_OR_NOTHROW {}